

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptStruct(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  EHlslTokenClass tokenClass;
  char *pcVar6;
  TSymbol *pTVar7;
  HlslGrammar *this_00;
  HlslParseContext *pHVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  TTypeList *typeList;
  TVector<glslang::TFunctionDeclarator> functionDeclarators;
  TString structName;
  ulong local_e0;
  TTypeList *local_d0;
  TVector<glslang::TFunctionDeclarator> local_c8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  TQualifier local_80;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokCBuffer);
  if (bVar2) {
    local_e0 = 5;
    uVar10 = 0;
  }
  else {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTBuffer);
    if (!bVar2) {
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokClass);
      if ((!bVar2) &&
         (bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokStruct),
         !bVar2)) {
        return false;
      }
      bVar2 = true;
      uVar10 = 0;
      local_e0 = 0;
      goto LAB_003a6d35;
    }
    local_e0 = 6;
    uVar10 = 0x800000000000;
  }
  bVar2 = false;
LAB_003a6d35:
  this_00 = this;
  tokenClass = HlslTokenStream::peek(&this->super_HlslTokenStream);
  pcVar6 = getTypeString(this_00,tokenClass);
  local_a8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIdentifier);
  if ((pcVar6 != (char *)0x0) || (bVar3)) {
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&local_a8,(this->super_HlslTokenStream).token.field_2.string);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_replace_aux(&local_a8,0,local_a8._M_string_length,1,*pcVar6);
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  local_80.semanticName = (char *)0x0;
  local_80._16_1_ = local_80._16_1_ & 0xf0;
  local_80.layoutOffset = -1;
  local_80.layoutAlign = -1;
  local_80.layoutPushConstant = false;
  local_80.layoutBufferReference = false;
  local_80.layoutPassthrough = false;
  local_80.layoutViewportRelative = false;
  local_80.layoutSecondaryViewportRelativeOffset = -0x800;
  local_80.layoutShaderRecord = false;
  local_80.layoutFullQuads = false;
  local_80.layoutQuadDeriv = false;
  local_80.layoutHitObjectShaderRecordNV = false;
  local_80.layoutBindlessSampler = false;
  local_80.layoutBindlessImage = false;
  local_80._44_1_ = 0;
  local_80._28_8_ = local_80._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
  local_80._36_8_ = local_80._36_8_ | 0x1ffffff7fffffff;
  local_80.spirvStorageClass = -1;
  local_80.spirvDecorate = (TSpirvDecorate *)0x0;
  local_80._8_8_ = local_80._8_8_ & 0x400000000;
  bVar3 = acceptPostDecls(this,&local_80);
  bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar4) {
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    .
    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HlslParseContext::pushNamespace(this->parseContext,&local_a8);
    bVar3 = acceptStructDeclarationList(this,&local_d0,nodeList,&local_c8);
    HlslParseContext::popNamespace(this->parseContext);
    if (bVar3) {
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
      if (bVar3) {
        if (bVar2) {
          TType::TType(type,local_d0,&local_a8);
        }
        else {
          local_80._8_8_ = local_e0 | uVar10 | local_80._8_8_ & 0xffff7fffffffff80;
          TType::TType(type,local_d0,&local_a8,&local_80);
        }
        HlslParseContext::declareStruct
                  (this->parseContext,&(this->super_HlslTokenStream).token.loc,&local_a8,type);
        if (0 < (int)((ulong)((long)local_c8.
                                    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    .
                                    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_c8.
                                   super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   .
                                   super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
          lVar11 = 0x18;
          lVar12 = 0;
          do {
            cVar5 = (**(code **)(**(long **)((long)&((local_c8.
                                                  super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  .
                                                  super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->loc).
                                                  name + lVar11) + 0x108))();
            if (cVar5 != '\0') {
              plVar1 = *(long **)((long)&((local_c8.
                                           super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                           .
                                           super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->loc).name +
                                 lVar11);
              (**(code **)(*plVar1 + 0xb8))(plVar1,type,this->intermediate->implicitThisName);
            }
            lVar12 = lVar12 + 1;
            lVar11 = lVar11 + 0x48;
          } while (lVar12 < (int)((ulong)((long)local_c8.
                                                super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                .
                                                super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_c8.
                                               super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                               .
                                               super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            0x38e38e39);
        }
        HlslParseContext::pushNamespace(this->parseContext,&local_a8);
        HlslParseContext::pushThisScope(this->parseContext,type,&local_c8);
        bVar2 = true;
        if (0 < (int)((ulong)((long)local_c8.
                                    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    .
                                    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_c8.
                                   super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   .
                                   super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
          lVar12 = 1;
          lVar11 = 0;
          do {
            HlslTokenStream::pushTokenStream
                      (&this->super_HlslTokenStream,
                       *(TVector<glslang::HlslToken> **)
                        ((long)&(local_c8.
                                 super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 .
                                 super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->body + lVar11));
            bVar3 = acceptFunctionBody(this,(TFunctionDeclarator *)
                                            ((long)&((local_c8.
                                                  super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  .
                                                  super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->loc).
                                                  name + lVar11),nodeList);
            if (!bVar3) {
              bVar2 = false;
            }
            HlslTokenStream::popTokenStream(&this->super_HlslTokenStream);
            if ((int)((ulong)((long)local_c8.
                                    super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    .
                                    super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_c8.
                                   super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   .
                                   super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 <=
                lVar12) break;
            lVar11 = lVar11 + 0x48;
            lVar12 = lVar12 + 1;
          } while (bVar2);
        }
        TSymbolTable::pop((this->parseContext->super_TParseContextBase).symbolTable,
                          (TPrecisionQualifier *)0x0);
        HlslParseContext::popNamespace(this->parseContext);
        return bVar2;
      }
      pHVar8 = this->parseContext;
      pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar6 = "}";
    }
    else {
      pHVar8 = this->parseContext;
      pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar6 = "struct member declarations";
    }
  }
  else {
    if ((!bVar3 && local_a8._M_string_length != 0) &&
       (pTVar7 = HlslParseContext::lookupUserType(this->parseContext,&local_a8,type),
       pTVar7 != (TSymbol *)0x0)) {
      return true;
    }
    pHVar8 = this->parseContext;
    pp_Var9 = (pHVar8->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar6 = "{";
  }
  (*pp_Var9[0x2d])(pHVar8,&(this->super_HlslTokenStream).token,"Expected",pcVar6,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptStruct(TType& type, TIntermNode*& nodeList)
{
    // This storage qualifier will tell us whether it's an AST
    // block type or just a generic structure type.
    TStorageQualifier storageQualifier = EvqTemporary;
    bool readonly = false;

    if (acceptTokenClass(EHTokCBuffer)) {
        // CBUFFER
        storageQualifier = EvqUniform;
    } else if (acceptTokenClass(EHTokTBuffer)) {
        // TBUFFER
        storageQualifier = EvqBuffer;
        readonly = true;
    } else if (! acceptTokenClass(EHTokClass) && ! acceptTokenClass(EHTokStruct)) {
        // Neither CLASS nor STRUCT
        return false;
    }

    // Now known to be one of CBUFFER, TBUFFER, CLASS, or STRUCT


    // IDENTIFIER.  It might also be a keyword which can double as an identifier.
    // For example:  'cbuffer ConstantBuffer' or 'struct ConstantBuffer' is legal.
    // 'cbuffer int' is also legal, and 'struct int' appears rejected only because
    // it attempts to redefine the 'int' type.
    const char* idString = getTypeString(peek());
    TString structName = "";
    if (peekTokenClass(EHTokIdentifier) || idString != nullptr) {
        if (idString != nullptr)
            structName = *idString;
        else
            structName = *token.string;
        advanceToken();
    }

    // post_decls
    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    bool postDeclsFound = acceptPostDecls(postDeclQualifier);

    // LEFT_BRACE, or
    // struct_type IDENTIFIER
    if (! acceptTokenClass(EHTokLeftBrace)) {
        if (structName.size() > 0 && !postDeclsFound && parseContext.lookupUserType(structName, type) != nullptr) {
            // struct_type IDENTIFIER
            return true;
        } else {
            expected("{");
            return false;
        }
    }


    // struct_declaration_list
    TTypeList* typeList;
    // Save each member function so they can be processed after we have a fully formed 'this'.
    TVector<TFunctionDeclarator> functionDeclarators;

    parseContext.pushNamespace(structName);
    bool acceptedList = acceptStructDeclarationList(typeList, nodeList, functionDeclarators);
    parseContext.popNamespace();

    if (! acceptedList) {
        expected("struct member declarations");
        return false;
    }

    // RIGHT_BRACE
    if (! acceptTokenClass(EHTokRightBrace)) {
        expected("}");
        return false;
    }

    // create the user-defined type
    if (storageQualifier == EvqTemporary)
        new(&type) TType(typeList, structName);
    else {
        postDeclQualifier.storage = storageQualifier;
        postDeclQualifier.readonly = readonly;
        new(&type) TType(typeList, structName, postDeclQualifier); // sets EbtBlock
    }

    parseContext.declareStruct(token.loc, structName, type);

    // For member functions: now that we know the type of 'this', go back and
    // - add their implicit argument with 'this' (not to the mangling, just the argument list)
    // - parse the functions, their tokens were saved for deferred parsing (now)
    for (int b = 0; b < (int)functionDeclarators.size(); ++b) {
        // update signature
        if (functionDeclarators[b].function->hasImplicitThis())
            functionDeclarators[b].function->addThisParameter(type, intermediate.implicitThisName);
    }

    // All member functions get parsed inside the class/struct namespace and with the
    // class/struct members in a symbol-table level.
    parseContext.pushNamespace(structName);
    parseContext.pushThisScope(type, functionDeclarators);
    bool deferredSuccess = true;
    for (int b = 0; b < (int)functionDeclarators.size() && deferredSuccess; ++b) {
        // parse body
        pushTokenStream(functionDeclarators[b].body);
        if (! acceptFunctionBody(functionDeclarators[b], nodeList))
            deferredSuccess = false;
        popTokenStream();
    }
    parseContext.popThisScope();
    parseContext.popNamespace();

    return deferredSuccess;
}